

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O2

this_t * __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<double>_>::turnedBack
          (BitMatrixCursor<ZXing::PointT<double>_> *this)

{
  double dVar1;
  this_t *in_RDI;
  undefined4 uVar3;
  undefined1 auVar2 [16];
  undefined4 uVar4;
  PointT<double> PVar5;
  
  in_RDI->img = this->img;
  dVar1 = (this->p).y;
  (in_RDI->p).x = (this->p).x;
  (in_RDI->p).y = dVar1;
  auVar2 = (undefined1  [16])this->d & _DAT_0019b270;
  uVar3 = auVar2._8_4_;
  uVar4 = auVar2._12_4_;
  if (auVar2._8_8_ <= auVar2._0_8_) {
    uVar3 = auVar2._0_4_;
    uVar4 = auVar2._4_4_;
  }
  auVar2._4_4_ = uVar4;
  auVar2._0_4_ = uVar3;
  auVar2._8_4_ = uVar3;
  auVar2._12_4_ = uVar4;
  PVar5 = (PointT<double>)divpd(_DAT_0019b280 ^ (undefined1  [16])this->d,auVar2);
  in_RDI->d = PVar5;
  return in_RDI;
}

Assistant:

this_t turnedBack() const noexcept { return {*img, p, back()}; }